

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountPtr.h
# Opt level: O0

RefCountPtr<MyClass> * __thiscall
RefCountPtr<MyClass>::operator=(RefCountPtr<MyClass> *this,MyClass *inValue)

{
  MyClass *inValue_local;
  RefCountPtr<MyClass> *this_local;
  
  if (this->mValue != (MyClass *)0x0) {
    RefCountObject::Release(&this->mValue->super_RefCountObject);
  }
  this->mValue = inValue;
  if (this->mValue != (MyClass *)0x0) {
    RefCountObject::AddRef(&this->mValue->super_RefCountObject);
  }
  return this;
}

Assistant:

RefCountPtr<T>&  RefCountPtr<T>::operator =(T* inValue)
{
	if(mValue)
		mValue->Release();
	mValue = inValue;
	if(mValue)
		mValue->AddRef();
	return *this;
}